

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXR(float **out_rgba,int *width,int *height,char *filename,char **err)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  float *pfVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  EXRImage exrImage;
  
  if (out_rgba == (float **)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar5 = "Invalid argument.\n";
  }
  else {
    exrImage.num_custom_attributes = 0;
    exrImage.num_channels = 0;
    exrImage.channel_names = (char **)0x0;
    exrImage.images = (uchar **)0x0;
    exrImage.pixel_types = (int *)0x0;
    exrImage.requested_pixel_types = (int *)0x0;
    iVar2 = ParseMultiChannelEXRHeaderFromFile(&exrImage,filename,err);
    if (iVar2 != 0) {
      return iVar2;
    }
    for (lVar6 = 0; lVar6 < exrImage.num_channels; lVar6 = lVar6 + 1) {
      if (exrImage.pixel_types[lVar6] == 1) {
        exrImage.requested_pixel_types[lVar6] = 2;
      }
    }
    iVar2 = LoadMultiChannelEXRFromFile(&exrImage,filename,err);
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar7 = 0;
    uVar3 = (ulong)(uint)exrImage.num_channels;
    if (exrImage.num_channels < 1) {
      uVar3 = uVar7;
    }
    uVar11 = 0xffffffffffffffff;
    uVar10 = 0xffffffff;
    uVar8 = 0xffffffff;
    uVar9 = 0xffffffff;
    for (; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      pcVar5 = exrImage.channel_names[uVar7];
      cVar1 = *pcVar5;
      if (cVar1 == 'R') {
        if (pcVar5[1] == '\0') {
          uVar11 = uVar7 & 0xffffffff;
        }
      }
      else if (cVar1 == 'A') {
        if (pcVar5[1] == '\0') {
          uVar9 = uVar7 & 0xffffffff;
        }
      }
      else if (cVar1 == 'B') {
        if (pcVar5[1] == '\0') {
          uVar8 = uVar7 & 0xffffffff;
        }
      }
      else if ((cVar1 == 'G') && (pcVar5[1] == '\0')) {
        uVar10 = uVar7 & 0xffffffff;
      }
    }
    if ((int)uVar11 == -1) {
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar5 = "R channel not found\n";
    }
    else if ((int)uVar10 == -1) {
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar5 = "G channel not found\n";
    }
    else {
      if ((int)uVar8 != -1) {
        pfVar4 = (float *)malloc((long)exrImage.width * (long)exrImage.height * 0x10);
        *out_rgba = pfVar4;
        uVar7 = 0;
        uVar3 = (ulong)(uint)(exrImage.height * exrImage.width);
        if (exrImage.height * exrImage.width < 1) {
          uVar3 = uVar7;
        }
        for (; uVar3 * 4 != uVar7; uVar7 = uVar7 + 4) {
          pfVar4[uVar7] = *(float *)(exrImage.images[(int)uVar11] + uVar7);
          pfVar4[uVar7 + 1] = *(float *)(exrImage.images[(int)uVar10] + uVar7);
          pfVar4[uVar7 + 2] = *(float *)(exrImage.images[(int)uVar8] + uVar7);
          fVar12 = 1.0;
          if (0 < (int)uVar9) {
            fVar12 = *(float *)(exrImage.images[uVar9] + uVar7);
          }
          pfVar4[uVar7 + 3] = fVar12;
        }
        *width = exrImage.width;
        *height = exrImage.height;
        return 0;
      }
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar5 = "B channel not found\n";
    }
  }
  *err = pcVar5;
  return -1;
}

Assistant:

int LoadEXR(float **out_rgba, int *width, int *height, const char *filename,
            const char **err) {

  if (out_rgba == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return -1;
  }

  EXRImage exrImage;
  InitEXRImage(&exrImage);

  {
    int ret = ParseMultiChannelEXRHeaderFromFile(&exrImage, filename, err);
    if (ret != 0) {
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exrImage.num_channels; i++) {
    if (exrImage.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exrImage.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  {
    int ret = LoadMultiChannelEXRFromFile(&exrImage, filename, err);
    if (ret != 0) {
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exrImage.num_channels; c++) {
    if (strcmp(exrImage.channel_names[c], "R") == 0) {
      idxR = c;
    } else if (strcmp(exrImage.channel_names[c], "G") == 0) {
      idxG = c;
    } else if (strcmp(exrImage.channel_names[c], "B") == 0) {
      idxB = c;
    } else if (strcmp(exrImage.channel_names[c], "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exrImage }
    return -1;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  (*out_rgba) =
      (float *)malloc(4 * sizeof(float) * exrImage.width * exrImage.height);
  for (int i = 0; i < exrImage.width * exrImage.height; i++) {
    (*out_rgba)[4 * i + 0] =
        reinterpret_cast<float **>(exrImage.images)[idxR][i];
    (*out_rgba)[4 * i + 1] =
        reinterpret_cast<float **>(exrImage.images)[idxG][i];
    (*out_rgba)[4 * i + 2] =
        reinterpret_cast<float **>(exrImage.images)[idxB][i];
    if (idxA > 0) {
      (*out_rgba)[4 * i + 3] =
          reinterpret_cast<float **>(exrImage.images)[idxA][i];
    } else {
      (*out_rgba)[4 * i + 3] = 1.0;
    }
  }

  (*width) = exrImage.width;
  (*height) = exrImage.height;

  // @todo { free exrImage }
  return 0;
}